

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm.h
# Opt level: O0

void __thiscall PointToPoint::kernel(PointToPoint *this,int param_2,int it)

{
  long *in_RDI;
  int i;
  MPI_Request *rq;
  int local_1c;
  long local_18;
  
  local_18 = in_RDI[7];
  for (local_1c = 0; local_1c < (int)in_RDI[3]; local_1c = local_1c + 1) {
    (**(code **)(*in_RDI + 0x38))(in_RDI,local_1c,local_18,local_18 + 8,0);
    local_18 = local_18 + 0x10;
  }
  MPI_Waitall((int)in_RDI[3] << 1,in_RDI[7],0);
  return;
}

Assistant:

inline void kernel(int, int it) override
    {
#ifdef DEBUG_MODE
        fill_sbuf(it);
#endif
        // pointer to the first request.
        auto* rq = reqs;
        for (int i = 0; i < n_partners; i++)
        {
            // As long as there is a waitall between iterations, we do not need
            // to use incremental tags across iterations.
            sendrecv(i, rq, rq + 1, 0);
            rq += 2;
        }

        MPI_Waitall(2 * n_partners, reqs, MPI_STATUSES_IGNORE);
#ifdef DEBUG_MODE
        for (int i = 0; i < n_partners; i++)
            check_rbuf(i, it);
#endif
    }